

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::Binding::Bind
          (BindResult *__return_storage_ptr__,Binding *this,ColumnRefExpression *colref,idx_t depth)

{
  bool bVar1;
  string *psVar2;
  reference other;
  pointer *__ptr;
  column_t column_index;
  LogicalType sql_type;
  Expression *local_108;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_100;
  size_type local_f8;
  idx_t local_f0;
  ColumnBinding local_e8;
  LogicalType local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ErrorData local_a0;
  
  local_f0 = depth;
  psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
  bVar1 = TryGetBindingIndex(this,psVar2,&local_f8);
  if (bVar1) {
    local_e8.table_index = this->index;
    local_e8.column_index = local_f8;
    other = vector<duckdb::LogicalType,_true>::get<true>(&this->types,local_f8);
    LogicalType::LogicalType(&local_d8,other);
    if ((colref->super_ParsedExpression).super_BaseExpression.alias._M_string_length == 0) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::get<true>(&this->names,local_f8);
      ::std::__cxx11::string::_M_assign
                ((string *)&(colref->super_ParsedExpression).super_BaseExpression.alias);
    }
    (*(colref->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression[7])
              (&local_c0,colref);
    make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding&,unsigned_long&>
              ((duckdb *)&local_108,&local_c0,&local_d8,&local_e8,&local_f0);
    local_100._M_head_impl = local_108;
    local_108 = (Expression *)0x0;
    BindResult::BindResult
              (__return_storage_ptr__,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_100);
    if (local_100._M_head_impl != (Expression *)0x0) {
      (*((local_100._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_100._M_head_impl = (Expression *)0x0;
    if (local_108 != (Expression *)0x0) {
      (**(code **)(*(long *)local_108 + 8))();
    }
    local_108 = (Expression *)0x0;
    ::std::__cxx11::string::~string((string *)&local_c0);
    LogicalType::~LogicalType(&local_d8);
  }
  else {
    psVar2 = ColumnRefExpression::GetColumnName_abi_cxx11_(colref);
    (*this->_vptr_Binding[2])(&local_a0,this,psVar2);
    BindResult::BindResult(__return_storage_ptr__,&local_a0);
    ErrorData::~ErrorData(&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult Binding::Bind(ColumnRefExpression &colref, idx_t depth) {
	column_t column_index;
	bool success = false;
	success = TryGetBindingIndex(colref.GetColumnName(), column_index);
	if (!success) {
		return BindResult(ColumnNotFoundError(colref.GetColumnName()));
	}
	ColumnBinding binding;
	binding.table_index = index;
	binding.column_index = column_index;
	LogicalType sql_type = types[column_index];
	if (colref.GetAlias().empty()) {
		colref.SetAlias(names[column_index]);
	}
	return BindResult(make_uniq<BoundColumnRefExpression>(colref.GetName(), sql_type, binding, depth));
}